

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstring.cpp
# Opt level: O0

FString * __thiscall FString::operator+=(FString *this,char *tail)

{
  size_t sVar1;
  size_t len;
  size_t len2;
  size_t len1;
  char *tail_local;
  FString *this_local;
  
  sVar1 = Len(this);
  len = strlen(tail);
  ReallocBuffer(this,sVar1 + len);
  StrCopy(this->Chars + sVar1,tail,len);
  return this;
}

Assistant:

FString &FString::operator += (const char *tail)
{
	size_t len1 = Len();
	size_t len2 = strlen(tail);
	ReallocBuffer (len1 + len2);
	StrCopy (Chars + len1, tail, len2);
	return *this;
}